

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.c
# Opt level: O2

int TestSuite_Run(TestSuite *suite)

{
  char *__s;
  FILE *__stream;
  int iVar1;
  int iVar2;
  size_t sVar3;
  Test *pTVar4;
  pthread_t *__newthread;
  undefined8 *__arg;
  int iVar5;
  int iVar6;
  pthread_mutex_t *__mutex;
  Test *pTVar7;
  bool bVar8;
  double dVar9;
  int local_e4;
  pthread_mutex_t mutex;
  char name [128];
  
  __stream = _stderr;
  if ((suite->flags & 4) == 0) {
    TestSuite_PrintJsonHeader(suite,_stdout);
    if (suite->outfile != (FILE *)0x0) {
      TestSuite_PrintJsonHeader(suite,suite->outfile);
    }
    if (suite->tests == (Test *)0x0) {
      TestSuite_PrintJsonFooter(_stdout);
      iVar6 = 0;
      if (suite->outfile != (FILE *)0x0) {
        TestSuite_PrintJsonFooter(suite->outfile);
        iVar6 = 0;
      }
    }
    else {
      pTVar7 = (Test *)&suite->tests;
      __s = suite->testname;
      if (__s == (char *)0x0) {
        if ((suite->flags & 8) != 0) {
          pthread_mutex_init((pthread_mutex_t *)name,(pthread_mutexattr_t *)0x0);
          iVar6 = -1;
          pTVar4 = pTVar7;
          do {
            pTVar4 = pTVar4->next;
            iVar6 = iVar6 + 1;
          } while (pTVar4 != (Test *)0x0);
          dVar9 = (double)iVar6 / 10.0;
          iVar2 = (int)dVar9 + (uint)((double)(int)dVar9 != dVar9);
          mutex.__data.__lock = iVar6;
          __newthread = (pthread_t *)calloc(10,8);
          iVar1 = 0;
          while (pTVar7 = pTVar7->next, pTVar7 != (Test *)0x0) {
            if (iVar1 % iVar2 == 0) {
              __arg = (undefined8 *)calloc(1,0x28);
              *__arg = suite;
              iVar5 = iVar6;
              if (iVar2 < iVar6) {
                iVar5 = iVar2;
              }
              __arg[1] = pTVar7;
              *(int *)(__arg + 2) = iVar5;
              __arg[4] = &mutex;
              __arg[3] = name;
              pthread_create(__newthread,(pthread_attr_t *)0x0,TestSuite_ParallelWorker,__arg);
              __newthread = __newthread + 1;
            }
            iVar1 = iVar1 + 1;
            iVar6 = iVar6 + -1;
          }
          sleep(0x1e);
          _Print_StdErr("Timed out, aborting!\n");
          abort();
        }
        pthread_mutex_init((pthread_mutex_t *)name,(pthread_mutexattr_t *)0x0);
        iVar2 = -1;
        pTVar4 = pTVar7;
        do {
          pTVar4 = pTVar4->next;
          iVar2 = iVar2 + 1;
        } while (pTVar4 != (Test *)0x0);
        iVar6 = 0;
        while( true ) {
          pTVar7 = pTVar7->next;
          mutex.__data.__lock = iVar2;
          if (pTVar7 == (Test *)0x0) break;
          iVar1 = TestSuite_RunTest(suite,pTVar7,(pthread_mutex_t *)name,(int *)mutex.__size);
          iVar6 = iVar6 + iVar1;
          iVar2 = iVar2 + -1;
        }
        TestSuite_PrintJsonFooter(_stdout);
        if (suite->outfile != (FILE *)0x0) {
          TestSuite_PrintJsonFooter(suite->outfile);
        }
        __mutex = (pthread_mutex_t *)name;
      }
      else {
        local_e4 = 1;
        sVar3 = strlen(__s);
        if (sVar3 == 0) {
          bVar8 = false;
        }
        else {
          bVar8 = __s[sVar3 - 1] == '*';
        }
        pthread_mutex_init((pthread_mutex_t *)&mutex,(pthread_mutexattr_t *)0x0);
        iVar6 = 0;
        while (pTVar7 = pTVar7->next, pTVar7 != (Test *)0x0) {
          snprintf(name,0x80,"%s%s",suite->name,pTVar7->name);
          if (bVar8) {
            sVar3 = strlen(__s);
            iVar2 = strncmp(name,__s,sVar3 - 1);
          }
          else {
            iVar2 = strcmp(name,__s);
          }
          if (iVar2 == 0) {
            iVar2 = TestSuite_RunTest(suite,pTVar7,&mutex,&local_e4);
            iVar6 = iVar6 + iVar2;
          }
        }
        TestSuite_PrintJsonFooter(_stdout);
        if (suite->outfile != (FILE *)0x0) {
          TestSuite_PrintJsonFooter(suite->outfile);
        }
        __mutex = &mutex;
      }
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    }
  }
  else {
    fprintf(_stderr,
            "usage: %s [OPTIONS]\n\nOptions:\n    -h, --help   Show this help menu.\n    -f           Do not fork() before running tests.\n    -l NAME      Run test by name, e.g. \"/Client/command\" or \"/Client/*\".\n    -p           Do not run tests in parallel.\n    -v           Be verbose with logs.\n    -F FILENAME  Write test results (JSON) to FILENAME.\n    -d           Print debug output (useful if a test hangs).\n\nTests:\n"
            ,suite->prgname);
    pTVar7 = (Test *)&suite->tests;
    while (pTVar7 = pTVar7->next, pTVar7 != (Test *)0x0) {
      fprintf(__stream,"    %s%s\n",suite->name,pTVar7->name);
    }
    fputc(10,__stream);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
TestSuite_Run (TestSuite *suite) /* IN */
{
   int failures = 0;

   if ((suite->flags & TEST_HELPONLY)) {
      TestSuite_PrintHelp (suite, stderr);
      return 0;
   }

   TestSuite_PrintJsonHeader (suite, stdout);
   if (suite->outfile) {
      TestSuite_PrintJsonHeader (suite, suite->outfile);
   }

   if (suite->tests) {
      if (suite->testname) {
         failures += TestSuite_RunNamed (suite, suite->testname);
      } else if ((suite->flags & TEST_THREADS)) {
         TestSuite_RunParallel (suite);
      } else {
         failures += TestSuite_RunSerial (suite);
      }
   } else {
      TestSuite_PrintJsonFooter (stdout);
      if (suite->outfile) {
         TestSuite_PrintJsonFooter (suite->outfile);
      }
   }

   return failures;
}